

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMethods.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::builtins::StringCompareMethod::eval
          (StringCompareMethod *this,EvalContext *context,Args *args,SourceRange param_4,
          SystemCallInfo *param_5)

{
  char cVar1;
  bool bVar2;
  string *this_00;
  string *psVar3;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *p2;
  char *p1;
  int result;
  string *rhs;
  string *lhs;
  ConstantValue rhsCv;
  ConstantValue lhsCv;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff04;
  char in_stack_ffffffffffffff06;
  char in_stack_ffffffffffffff07;
  Expression *in_stack_ffffffffffffff08;
  bitwidth_t bits;
  char *local_b0;
  
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,0);
  Expression::eval(in_stack_ffffffffffffff08,
                   (EvalContext *)
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,
                                     CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)))
                  );
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RCX,1);
  Expression::eval(in_stack_ffffffffffffff08,
                   (EvalContext *)
                   CONCAT17(in_stack_ffffffffffffff07,
                            CONCAT16(in_stack_ffffffffffffff06,
                                     CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00)))
                  );
  bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x138f98b);
  if ((bVar2) &&
     (bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0x138f9a8), bVar2)) {
    this_00 = slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0x138fa0e);
    psVar3 = slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0x138fa2c);
    bits = (bitwidth_t)((ulong)psVar3 >> 0x20);
    if (((ulong)in_RSI[3]._M_dataplus._M_p & 0x10000) == 0) {
      in_stack_fffffffffffffefc =
           std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                     (in_RSI,in_RDI);
    }
    else {
      local_b0 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_ffffffffffffff07,
                                CONCAT16(in_stack_ffffffffffffff06,
                                         CONCAT24(in_stack_ffffffffffffff04,
                                                  in_stack_ffffffffffffff00))));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff07,
                          CONCAT16(in_stack_ffffffffffffff06,
                                   CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))));
      do {
        in_stack_ffffffffffffff07 = charToLower('\0');
        in_stack_ffffffffffffff00 = (int)in_stack_ffffffffffffff07;
        in_stack_ffffffffffffff06 = charToLower('\0');
        bits = (bitwidth_t)((ulong)psVar3 >> 0x20);
        if (in_stack_ffffffffffffff00 != in_stack_ffffffffffffff06) break;
        cVar1 = *local_b0;
        local_b0 = local_b0 + 1;
      } while (cVar1 != '\0');
    }
    SVInt::SVInt((SVInt *)this_00,bits,
                 CONCAT17(in_stack_ffffffffffffff07,
                          CONCAT16(in_stack_ffffffffffffff06,
                                   CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))),
                 SUB41((uint)in_stack_fffffffffffffefc >> 0x18,0));
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))),
               (SVInt *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    SVInt::~SVInt((SVInt *)this_00);
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,
                                 CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))),
               (nullptr_t)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x138fb86);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0x138fb93);
  return (ConstantValue *)in_RDI;
}

Assistant:

ConstantValue eval(EvalContext& context, const Args& args, SourceRange,
                       const CallExpression::SystemCallInfo&) const final {
        auto lhsCv = args[0]->eval(context);
        auto rhsCv = args[1]->eval(context);
        if (!lhsCv || !rhsCv)
            return nullptr;

        std::string& lhs = lhsCv.str();
        std::string& rhs = rhsCv.str();

        int result;
        if (ignoreCase) {
            // No convenient way to do this with standard lib functions :(
            const char* p1 = lhs.c_str();
            const char* p2 = rhs.c_str();
            while ((result = charToLower(*p1) - charToLower(*p2++)) == 0) {
                if (*p1++ == '\0')
                    break;
            }
        }
        else {
            result = lhs.compare(rhs);
            if (result < 0)
                result = -1;
            else if (result > 0)
                result = 1;
        }

        return SVInt(32, uint64_t(result), true);
    }